

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::Hook(Debugger *this,lua_Debug *ar,lua_State *L)

{
  pointer pfVar1;
  EmmyDebuggerManager *pEVar2;
  bool bVar3;
  int iVar4;
  iterator __begin3;
  pointer exec;
  shared_ptr<BreakPoint> bp;
  shared_ptr<HookState> state;
  undefined1 local_78 [8];
  bool local_70;
  undefined7 uStack_6f;
  shared_ptr<BreakPoint> local_68;
  EmmyDebuggerManager *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  __shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> local_40 [16];
  
  if (this->skipHook != false) {
    return;
  }
  this->currentL = L;
  iVar4 = getDebugEvent(ar);
  if (iVar4 != 2) {
    return;
  }
  local_78 = (undefined1  [8])&this->luaThreadMtx;
  local_70 = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
  local_70 = true;
  exec = (this->luaThreadExecutors).
         super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->luaThreadExecutors).
           super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (exec != pfVar1) {
    do {
      ExecuteWithSkipHook(this,exec);
      exec = exec + 1;
    } while (exec != pfVar1);
    std::
    vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>::
    _M_erase_at_end(&this->luaThreadExecutors,
                    (this->luaThreadExecutors).
                    super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
  FindBreakPoint((Debugger *)local_78,(lua_Debug *)this);
  if (local_78 != (undefined1  [8])0x0) {
    local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_78;
    local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_6f,local_70);
    if ((lua_State *)
        local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (lua_State *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((lua_State *)
                 local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->tt =
             *(int *)&((lua_State *)
                      local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->tt + 1;
        UNLOCK();
      }
      else {
        *(int *)&((lua_State *)
                 local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->tt =
             *(int *)&((lua_State *)
                      local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->tt + 1;
      }
    }
    bVar3 = ProcessBreakPoint(this,&local_68);
    if ((lua_State *)
        local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (lua_State *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (bVar3) {
      HandleBreak(this);
      goto LAB_001446fc;
    }
  }
  local_58 = (EmmyDebuggerManager *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->hookStateMtx);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_58 = (EmmyDebuggerManager *)
             (this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (a_Stack_50,
             &(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
  pEVar2 = local_58;
  if (local_58 != (EmmyDebuggerManager *)0x0) {
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Debugger,void>
              (local_40,(__weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this);
    (*(code *)(pEVar2->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr[1].super_HookState.currentStateL)(pEVar2,local_40,this->currentL,ar);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
    }
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
LAB_001446fc:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_6f,local_70) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_6f,local_70));
  }
  return;
}

Assistant:

void Debugger::Hook(lua_Debug *ar, lua_State *L) {
	if (skipHook) {
		return;
	}
	// 设置当前协程
	SetCurrentState(L);

	if (getDebugEvent(ar) == LUA_HOOKLINE) {
		// 对luaTreadExecutors 执行加锁
		{
			std::unique_lock<std::mutex> lock(luaThreadMtx);
			if (!luaThreadExecutors.empty()) {
				for (auto &executor: luaThreadExecutors) {
					ExecuteWithSkipHook(executor);
				}
				luaThreadExecutors.clear();
			}
		}
		auto bp = FindBreakPoint(ar);
		if (bp && ProcessBreakPoint(bp)) {
			HandleBreak();
			return;
		}
		// 加锁

		std::shared_ptr<HookState> state = nullptr;

		{
			std::lock_guard<std::mutex> lock(hookStateMtx);
			state = hookState;
		}

		if (state) {
			state->ProcessHook(shared_from_this(), currentL, ar);
		}
	}
}